

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O3

set<int,_std::less<int>,_std::allocator<int>_> *
blockHasVar(set<int,_std::less<int>,_std::allocator<int>_> *__return_storage_ptr__,VarId *var,
           map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
           *def,map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                *use)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_node_base *p_Var2;
  _Base_ptr *pp_Var3;
  long lVar4;
  _Self __tmp_1;
  _Self __tmp;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  for (p_Var2 = (def->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(def->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    lVar4 = (long)p_Var2[1]._M_left - (long)p_Var2[1]._M_parent;
    if (lVar4 != 0) {
      lVar4 = lVar4 >> 4;
      lVar4 = lVar4 + (ulong)(lVar4 == 0);
      pp_Var3 = &(p_Var2[1]._M_parent)->_M_parent;
      do {
        if (*(uint32_t *)pp_Var3 == var->id) {
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     __return_storage_ptr__,(int *)(p_Var2 + 1));
          break;
        }
        pp_Var3 = pp_Var3 + 2;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
  }
  p_Var2 = (use->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var2 == &(use->_M_t)._M_impl.super__Rb_tree_header) {
      return __return_storage_ptr__;
    }
    lVar4 = (long)p_Var2[1]._M_left - (long)p_Var2[1]._M_parent;
    if (lVar4 != 0) {
      lVar4 = lVar4 >> 4;
      lVar4 = lVar4 + (ulong)(lVar4 == 0);
      pp_Var3 = &(p_Var2[1]._M_parent)->_M_parent;
      do {
        if (*(uint32_t *)pp_Var3 == var->id) {
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     __return_storage_ptr__,(int *)(p_Var2 + 1));
          break;
        }
        pp_Var3 = pp_Var3 + 2;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
  } while( true );
}

Assistant:

set<int> blockHasVar(mir::inst::VarId var,
                     map<int, vector<mir::inst::VarId>> def,
                     map<int, vector<mir::inst::VarId>> use) {
  map<int, vector<mir::inst::VarId>>::iterator it;
  set<int> s;
  for (it = def.begin(); it != def.end(); it++) {
    for (int i = 0; i < it->second.size(); i++) {
      if (it->second[i] == var) {
        s.insert(it->first);
        break;
      }
    }
  }
  for (it = use.begin(); it != use.end(); it++) {
    for (int i = 0; i < it->second.size(); i++) {
      if (it->second[i] == var) {
        s.insert(it->first);
        break;
      }
    }
  }
  return s;
}